

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O1

unsigned_long vm_swap_total(void)

{
  char *pcVar1;
  unsigned_long uVar2;
  sensor_slurp proc_meminfo;
  char *local_2010;
  char local_2008 [8192];
  
  memcpy(&local_2010,&PTR_anon_var_dwarf_3e30c_00165ab8,0x2008);
  slurpfile(local_2010,local_2008,0x2000);
  pcVar1 = strstr(local_2008,"SwapFree:");
  if (pcVar1 == (char *)0x0) {
    uVar2 = 0;
  }
  else {
    pcVar1 = skip_token(pcVar1);
    uVar2 = strtoul(pcVar1,(char **)0x0,10);
  }
  return uVar2;
}

Assistant:

unsigned long vm_swap_total ( void )
{
  unsigned long val = 0;
#ifdef HAVE_MAC_SYSCTL
  static int mib[2] = {CTL_VM, VM_SWAPUSAGE};
  struct xsw_usage swapval;
  size_t vlen;
  vlen = sizeof(struct xsw_usage);
  sysctl(mib,2,&swapval,&vlen,NULL,0);
  val = (unsigned long) swapval.xsu_total;
  
#else
  char *p;
   
  sensor_slurp proc_meminfo = { "/proc/meminfo" };
  p = strstr( update_file(&proc_meminfo), "SwapFree:" );
  if(p) {
    p = skip_token(p);
    val =  strtoul( p, NULL, 10 ); 
  } else {
    val = 0;
  }
#endif //end HAVE_MAC_SYSCTL
  return val;
}